

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

int AnalyzeResponseDescriptorRPLIDAR
              (uchar *buf,int buflen,int *pDataResponseLength,int *pSendMode,int *pDataType,
              int *pnbBytesToRequest,int *pnbBytesToDiscard)

{
  int iVar1;
  
  *pDataResponseLength = 0;
  *pnbBytesToRequest = -1;
  *pnbBytesToDiscard = 0;
  if (buflen < 7) {
    *pnbBytesToRequest = 7 - buflen;
    iVar1 = 6;
  }
  else if ((*buf == 0xa5) && (buf[1] == 'Z')) {
    iVar1 = GetDataResponseLengthFromResponseDescriptorRPLIDAR(buf,buflen);
    *pDataResponseLength = iVar1;
    *pSendMode = (uint)(buf[5] >> 6);
    *pDataType = (uint)buf[6];
    iVar1 = 0;
  }
  else {
    puts("Warning : RPLIDAR bad start flag. ");
    *pnbBytesToDiscard = 1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int AnalyzeResponseDescriptorRPLIDAR(unsigned char* buf, int buflen, int* pDataResponseLength, int* pSendMode, int* pDataType, 
							int* pnbBytesToRequest, int* pnbBytesToDiscard)
{
	*pDataResponseLength = 0;
	*pnbBytesToRequest = -1;
	*pnbBytesToDiscard = 0;
	if (buflen < NB_BYTES_RESPONSE_DESCRIPTOR_RPLIDAR)
	{
		*pnbBytesToRequest = NB_BYTES_RESPONSE_DESCRIPTOR_RPLIDAR-buflen;
		return EXIT_OUT_OF_MEMORY;
	}
	if ((buf[0] != START_FLAG1_RPLIDAR)||(buf[1] != START_FLAG2_RPLIDAR))
	{
		printf("Warning : RPLIDAR bad start flag. \n");
		*pnbBytesToDiscard = 1; // We are only sure that the first start flag byte can be discarded...
		return EXIT_FAILURE;
	}
	*pDataResponseLength = GetDataResponseLengthFromResponseDescriptorRPLIDAR(buf, buflen);	
	*pSendMode = GetSendModeFromResponseDescriptorRPLIDAR(buf, buflen);	
	*pDataType = buf[6];

	return EXIT_SUCCESS;
}